

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O0

int __thiscall MobileElementManager::Choose(MobileElementManager *this)

{
  size_type sVar1;
  runtime_error *prVar2;
  ulong uVar3;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  string err_1;
  int pol_index;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  string err;
  MobileElementManager *this_local;
  
  err.field_2._8_8_ = this;
  sVar1 = std::vector<double,_std::allocator<double>_>::size(&this->prop_list_);
  if (sVar1 == 0) {
    std::__cxx11::to_string(&local_70,this->prop_sum_);
    std::operator+(&local_50,"There are no active polymerases on polymer (propensity sum: ",
                   &local_70);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                   &local_50,").");
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,(string *)local_30);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  err_1.field_2._8_4_ =
       Random::
       WeightedChoiceIndex<std::pair<std::shared_ptr<MobileElement>,std::shared_ptr<Polymer>>>
                 (&this->polymerases_,&this->prop_list_);
  uVar3 = (ulong)(int)err_1.field_2._8_4_;
  sVar1 = std::
          vector<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
          ::size(&this->polymerases_);
  if (sVar1 <= uVar3) {
    std::__cxx11::to_string(&local_e0,err_1.field_2._8_4_);
    std::operator+(&local_c0,"Attempting to move unbound polymerase with index ",&local_e0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   &local_c0," on polymer.");
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,(string *)local_a0);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar3 = (ulong)(int)err_1.field_2._8_4_;
  sVar1 = std::vector<double,_std::allocator<double>_>::size(&this->prop_list_);
  if (sVar1 <= uVar3) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Prop list vector index is invalid (before move).");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return err_1.field_2._8_4_;
}

Assistant:

int MobileElementManager::Choose() {
  /*for (int i = 0; i < prop_list_.size(); i++) {
    std::cout << i << " :" << prop_list_[i] << std::endl;
  }*/
  if (prop_list_.size() == 0) {
    std::string err =
        "There are no active polymerases on polymer (propensity sum: " +
        std::to_string(prop_sum_) + ").";
    throw std::runtime_error(err);
  }
  int pol_index = Random::WeightedChoiceIndex(polymerases_, prop_list_);
  // std::cout << "chosen index :" << pol_index << std::endl;
  // Error checking to make sure that pol is in vector
  if (pol_index >= polymerases_.size()) {
    std::string err = "Attempting to move unbound polymerase with index " +
                      std::to_string(pol_index) + " on polymer.";
    throw std::runtime_error(err);
  }
  if (pol_index >= prop_list_.size()) {
    throw std::runtime_error(
        "Prop list vector index is invalid (before move).");
  }
  return pol_index;
}